

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
Parfait::UgridReader::readQuads
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *filename,int begin,
          int end,bool swapBytes)

{
  undefined1 uVar1;
  undefined1 uVar2;
  pointer pcVar3;
  pointer piVar4;
  int *piVar5;
  int iVar6;
  string *__rhs;
  int *vertex;
  FILE *__stream;
  long lVar7;
  int *piVar8;
  domain_error *this;
  vector<int,_std::allocator<int>_> *__range1;
  size_type __n;
  allocator_type local_9d;
  int local_9c;
  int ntri;
  int nnodes;
  string *local_90;
  int nhex;
  int nprism;
  int npyr;
  int ntet;
  int nquad;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar3 = (filename->_M_dataplus)._M_p;
  local_90 = filename;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + filename->_M_string_length);
  readHeader(&local_70,&nnodes,&ntri,&nquad,&ntet,&npyr,&nprism,&nhex,swapBytes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  __n = (size_type)((end - begin) * 4);
  local_50._M_dataplus._M_p._0_4_ = 0;
  local_9c = end;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict2 *)&local_50,&local_9d);
  __rhs = local_90;
  __stream = fopen((local_90->_M_dataplus)._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,((long)(begin * 4) + (long)ntri * 3) * 4 + (long)nnodes * 0x18 + 0x1c,0);
    fread((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start,4,__n,__stream);
    fclose(__stream);
    if (swapBytes && local_9c != begin) {
      lVar7 = 0;
      do {
        piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6 = piVar4[lVar7];
        uVar1 = *(undefined1 *)((long)piVar4 + lVar7 * 4 + 1);
        uVar2 = *(undefined1 *)((long)piVar4 + lVar7 * 4 + 2);
        *(undefined1 *)(piVar4 + lVar7) = *(undefined1 *)((long)piVar4 + lVar7 * 4 + 3);
        *(undefined1 *)((long)piVar4 + lVar7 * 4 + 1) = uVar2;
        *(undefined1 *)((long)piVar4 + lVar7 * 4 + 2) = uVar1;
        *(char *)((long)piVar4 + lVar7 * 4 + 3) = (char)iVar6;
        lVar7 = lVar7 + 1;
      } while (__n + (__n == 0) != lVar7);
    }
    piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start; piVar8 != piVar5; piVar8 = piVar8 + 1) {
      *piVar8 = *piVar8 + -1;
    }
    return __return_storage_ptr__;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Could not open .ugrid file: ",__rhs);
  std::domain_error::domain_error(this,(string *)&local_50);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline std::vector<int> Parfait::UgridReader::readQuads(std::string filename,int begin,int end,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    // get header info and allocate space for triangles
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);
    int nrequested = end - begin;
    std::vector<int> quads(4*nrequested,0);

    FILE *f = fopen(filename.c_str(),"rb");
    if(f == NULL){
        throw std::domain_error("Could not open .ugrid file: "+filename);
    }
    unsigned long int byteOffset = 7*sizeof(int) + 3*nnodes*sizeof(double);
    byteOffset += 3*ntri*sizeof(int);
    byteOffset += 4*begin*sizeof(int);
    fseek(f,byteOffset,SEEK_SET);
    fread(&quads[0],sizeof(int),4*nrequested,f);
    fclose(f);
    if(swapBytes) {
        for (size_t i = 0; i < 4 * nrequested; i++) {
            bswap_32(&quads[i]);
        }
    }

    for(int& vertex : quads)
        vertex--;

    return quads;
}